

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O3

Slot * __thiscall
wasm::ModuleSplitting::anon_unknown_0::TableSlotManager::getSlot
          (Slot *__return_storage_ptr__,TableSlotManager *this,Name func,HeapType type)

{
  _Rb_tree_header *p_Var1;
  Module *pMVar2;
  pointer puVar3;
  _Head_base<0UL,_wasm::DylinkSection_*,_false> _Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  Name func_00;
  Name func_01;
  bool bVar7;
  Table *pTVar8;
  Type type_00;
  ElementSegment *pEVar9;
  undefined1 reuse;
  undefined1 auVar10 [8];
  pointer puVar11;
  pointer puVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  _Base_ptr p_Var16;
  uint uVar17;
  _Base_ptr p_Var18;
  Name root;
  Name NVar19;
  Name NVar20;
  string_view sVar21;
  Name table;
  Name name;
  Type local_a0;
  HeapType local_98;
  string_view local_90;
  Expression *local_80;
  undefined1 auStack_78 [8];
  Builder builder;
  undefined1 local_50 [8];
  Name func_local;
  _Head_base<0UL,_wasm::Table_*,_false> local_38;
  
  func_local.super_IString.str._M_len = func.super_IString.str._M_str;
  local_50 = func.super_IString.str._M_len;
  p_Var18 = (this->funcIndices)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_98.id = type.id;
  if (p_Var18 != (_Base_ptr)0x0) {
    p_Var1 = &(this->funcIndices)._M_t._M_impl.super__Rb_tree_header;
    p_Var16 = &p_Var1->_M_header;
    func_local.super_IString.str._M_str = (char *)this;
    do {
      bVar7 = IString::operator<((IString *)(p_Var18 + 1),(IString *)local_50);
      this = (TableSlotManager *)func_local.super_IString.str._M_str;
      if (!bVar7) {
        p_Var16 = p_Var18;
      }
      p_Var18 = (&p_Var18->_M_left)[bVar7];
    } while (p_Var18 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var16 != p_Var1) &&
       (bVar7 = IString::operator<((IString *)local_50,(IString *)(p_Var16 + 1)), !bVar7)) {
      pTVar8 = (Table *)p_Var16[2]._M_left;
      *(Table **)&__return_storage_ptr__->index = pTVar8;
      p_Var18 = p_Var16[1]._M_left;
      p_Var5 = p_Var16[1]._M_right;
      p_Var6 = p_Var16[2]._M_parent;
      (__return_storage_ptr__->global).super_IString.str._M_len = *(size_t *)(p_Var16 + 2);
      (__return_storage_ptr__->global).super_IString.str._M_str = (char *)p_Var6;
      (__return_storage_ptr__->tableName).super_IString.str._M_len = (size_t)p_Var18;
      (__return_storage_ptr__->tableName).super_IString.str._M_str = (char *)p_Var5;
      return (Slot *)pTVar8;
    }
  }
  pEVar9 = this->activeSegment;
  if (pEVar9 != (ElementSegment *)0x0) goto LAB_00aa9ae5;
  pTVar8 = this->activeTable;
  if (pTVar8 == (Table *)0x0) {
    pMVar2 = this->module;
    NVar19 = Name::fromInt(0);
    builder.wasm = (Module *)0x0;
    NVar20.super_IString.str._M_str = (char *)auStack_78;
    NVar20.super_IString.str._M_len = (size_t)NVar19.super_IString.str._M_str;
    auStack_78 = (undefined1  [8])pMVar2;
    NVar20 = Names::getValidName(NVar19.super_IString.str._M_len,NVar20,
                                 (function<bool_(wasm::Name)> *)auStack_78);
    func_local.super_IString.str._M_str = (char *)pMVar2;
    std::
    _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:76:23)>
    ::_M_manager((_Any_data *)auStack_78,(_Any_data *)auStack_78,__destroy_functor);
    wasm::Type::Type((Type *)auStack_78,(HeapType)0x1,Nullable);
    NVar19.super_IString.str._M_str = NVar20.super_IString.str._M_len;
    NVar19.super_IString.str._M_len = (size_t)&local_38;
    auVar10 = auStack_78;
    Builder::makeTable(NVar19,(Type)NVar20.super_IString.str._M_str,(Address)auStack_78,(Address)0x0
                      );
    reuse = SUB81(auVar10,0);
    pTVar8 = Module::addTable((Module *)func_local.super_IString.str._M_str,
                              (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                              &local_38);
    if ((ElementSegment *)local_38._M_head_impl != (ElementSegment *)0x0) {
      operator_delete(local_38._M_head_impl,0x50);
    }
    this->activeTable = pTVar8;
    auStack_78 = (undefined1  [8])
                 (pTVar8->super_Importable).super_Named.name.super_IString.str._M_len;
    builder.wasm = (Module *)(pTVar8->super_Importable).super_Named.name.super_IString.str._M_str;
    sVar21 = IString::interned((IString *)0x0,(string_view)ZEXT816(0xbd4a1c),(bool)reuse);
    (this->activeBase).tableName.super_IString.str._M_len = (size_t)auStack_78;
    (this->activeBase).tableName.super_IString.str._M_str = (char *)builder.wasm;
    (this->activeBase).global.super_IString.str = sVar21;
    (this->activeBase).index = 0;
    pTVar8 = this->activeTable;
  }
  pMVar2 = this->module;
  puVar12 = (pMVar2->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pMVar2->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar15 = (long)puVar3 - (long)puVar12;
  if (0 < (long)uVar15 >> 5) {
    pcVar13 = (pTVar8->super_Importable).super_Named.name.super_IString.str._M_str;
    puVar11 = (pointer)((long)&(puVar12->_M_t).
                               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl +
                       (uVar15 & 0xffffffffffffffe0));
    lVar14 = ((long)uVar15 >> 5) + 1;
    puVar12 = puVar12 + 2;
    do {
      if (*(char **)((long)&(puVar12[-2]._M_t.
                             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                            table + 8) == pcVar13) {
        puVar12 = puVar12 + -2;
        goto LAB_00aa99f3;
      }
      if (*(char **)((long)&(puVar12[-1]._M_t.
                             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                            table + 8) == pcVar13) {
        puVar12 = puVar12 + -1;
        goto LAB_00aa99f3;
      }
      if (*(char **)((long)&((puVar12->_M_t).
                             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                            table + 8) == pcVar13) goto LAB_00aa99f3;
      if (*(char **)((long)&(puVar12[1]._M_t.
                             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                            table + 8) == pcVar13) {
        puVar12 = puVar12 + 1;
        goto LAB_00aa99f3;
      }
      lVar14 = lVar14 + -1;
      puVar12 = puVar12 + 4;
    } while (1 < lVar14);
    uVar15 = (long)puVar3 - (long)puVar11;
    puVar12 = puVar11;
  }
  lVar14 = (long)uVar15 >> 3;
  if (lVar14 == 3) {
    pcVar13 = (pTVar8->super_Importable).super_Named.name.super_IString.str._M_str;
    if (*(char **)((long)&((puVar12->_M_t).
                           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                           .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                          table + 8) != pcVar13) {
      puVar12 = puVar12 + 1;
      goto LAB_00aa99d2;
    }
LAB_00aa99f3:
    if (puVar12 != puVar3) {
      __assert_fail("std::all_of(module.elementSegments.begin(), module.elementSegments.end(), [&](std::unique_ptr<ElementSegment>& segment) { return segment->table != activeTable->name; })"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/module-splitting.cpp"
                    ,0xe7,
                    "TableSlotManager::Slot wasm::ModuleSplitting::(anonymous namespace)::TableSlotManager::getSlot(Name, HeapType)"
                   );
    }
  }
  else {
    if (lVar14 == 2) {
      pcVar13 = (pTVar8->super_Importable).super_Named.name.super_IString.str._M_str;
LAB_00aa99d2:
      if (*(char **)((long)&((puVar12->_M_t).
                             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                            table + 8) != pcVar13) {
        puVar12 = puVar12 + 1;
        goto LAB_00aa99df;
      }
      goto LAB_00aa99f3;
    }
    if (lVar14 == 1) {
      pcVar13 = (pTVar8->super_Importable).super_Named.name.super_IString.str._M_str;
LAB_00aa99df:
      if (*(char **)((long)&((puVar12->_M_t).
                             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                            table + 8) != pcVar13) {
        puVar12 = puVar3;
      }
      goto LAB_00aa99f3;
    }
  }
  NVar20 = Name::fromInt(0);
  builder.wasm = (Module *)0x0;
  root.super_IString.str._M_str = (char *)auStack_78;
  root.super_IString.str._M_len = (size_t)NVar20.super_IString.str._M_str;
  auStack_78 = (undefined1  [8])pMVar2;
  local_90 = (string_view)
             Names::getValidName(NVar20.super_IString.str._M_len,root,
                                 (function<bool_(wasm::Name)> *)auStack_78);
  func_local.super_IString.str._M_str = (char *)pMVar2;
  std::
  _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:84:11)>
  ::_M_manager((_Any_data *)auStack_78,(_Any_data *)auStack_78,__destroy_functor);
  pcVar13 = (char *)(this->activeTable->super_Importable).super_Named.name.super_IString.str._M_len;
  local_80 = (Expression *)
             (this->activeTable->super_Importable).super_Named.name.super_IString.str._M_str;
  auStack_78 = (undefined1  [8])this->module;
  type_00.id = (uintptr_t)Builder::makeConst<int>((Builder *)auStack_78,0);
  wasm::Type::Type(&local_a0,(HeapType)0x1,Nullable);
  table.super_IString.str._M_str = pcVar13;
  table.super_IString.str._M_len = (size_t)local_90._M_str;
  name.super_IString.str._M_str = (char *)local_90._M_len;
  name.super_IString.str._M_len = (size_t)&local_38;
  Builder::makeElementSegment(name,table,local_80,type_00);
  pEVar9 = Module::addElementSegment
                     ((Module *)func_local.super_IString.str._M_str,
                      (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                       *)&local_38);
  if ((ElementSegment *)local_38._M_head_impl != (ElementSegment *)0x0) {
    std::default_delete<wasm::ElementSegment>::operator()
              ((default_delete<wasm::ElementSegment> *)&local_38,
               (ElementSegment *)local_38._M_head_impl);
  }
  this->activeSegment = pEVar9;
LAB_00aa9ae5:
  pcVar13 = (this->activeBase).tableName.super_IString.str._M_str;
  (__return_storage_ptr__->tableName).super_IString.str._M_len =
       (this->activeBase).tableName.super_IString.str._M_len;
  (__return_storage_ptr__->tableName).super_IString.str._M_str = pcVar13;
  pcVar13 = (this->activeBase).global.super_IString.str._M_str;
  (__return_storage_ptr__->global).super_IString.str._M_len =
       (this->activeBase).global.super_IString.str._M_len;
  (__return_storage_ptr__->global).super_IString.str._M_str = pcVar13;
  uVar17 = (int)((ulong)((long)(pEVar9->data).
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pEVar9->data).
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) +
           (this->activeBase).index;
  __return_storage_ptr__->index = uVar17;
  auStack_78 = (undefined1  [8])this->module;
  func_00.super_IString.str._M_str = (char *)func_local.super_IString.str._M_len;
  func_00.super_IString.str._M_len = (size_t)local_50;
  local_38._M_head_impl = (Table *)Builder::makeRefFunc((Builder *)auStack_78,func_00,local_98);
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&pEVar9->data,
             (Expression **)&local_38);
  func_01.super_IString.str._M_str = (char *)func_local.super_IString.str._M_len;
  func_01.super_IString.str._M_len = (size_t)local_50;
  addSlot(this,func_01,*__return_storage_ptr__);
  pTVar8 = this->activeTable;
  if ((pTVar8->initial).addr <= (ulong)uVar17) {
    (pTVar8->initial).addr = (ulong)(uVar17 + 1);
    _Var4._M_head_impl =
         (this->module->dylinkSection)._M_t.
         super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
         super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
         super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
    if (_Var4._M_head_impl != (DylinkSection *)0x0) {
      (_Var4._M_head_impl)->tableSize = uVar17 + 1;
    }
  }
  if ((pTVar8->max).addr <= (ulong)uVar17) {
    (pTVar8->max).addr = (ulong)(uVar17 + 1);
  }
  return (Slot *)pTVar8;
}

Assistant:

TableSlotManager::Slot TableSlotManager::getSlot(Name func, HeapType type) {
  auto slotIt = funcIndices.find(func);
  if (slotIt != funcIndices.end()) {
    return slotIt->second;
  }

  // If there are no segments yet, allocate one.
  if (activeSegment == nullptr) {
    if (activeTable == nullptr) {
      activeTable = makeTable();
      activeBase = {activeTable->name, "", 0};
    }

    // None of the existing segments should refer to the active table
    assert(std::all_of(module.elementSegments.begin(),
                       module.elementSegments.end(),
                       [&](std::unique_ptr<ElementSegment>& segment) {
                         return segment->table != activeTable->name;
                       }));

    activeSegment = makeElementSegment();
  }

  Slot newSlot = {activeBase.tableName,
                  activeBase.global,
                  activeBase.index + Index(activeSegment->data.size())};

  Builder builder(module);
  activeSegment->data.push_back(builder.makeRefFunc(func, type));

  addSlot(func, newSlot);
  if (activeTable->initial <= newSlot.index) {
    activeTable->initial = newSlot.index + 1;
    // TODO: handle the active table not being the dylink table (#3823)
    if (module.dylinkSection) {
      module.dylinkSection->tableSize = activeTable->initial;
    }
  }
  if (activeTable->max <= newSlot.index) {
    activeTable->max = newSlot.index + 1;
  }
  return newSlot;
}